

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GetMemberOfVectorOfStruct
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr,
          ImportMap *imports)

{
  Value *type;
  Parser *pPVar1;
  _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *this_00;
  size_t t;
  string *psVar2;
  string return_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  string *local_108;
  _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_100;
  Type *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  Type local_d0;
  ImportMapEntry import_entry;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0.base_type = (field->value).type.element;
  local_d0.fixed_length = (field->value).type.fixed_length;
  local_d0.element = BASE_TYPE_NONE;
  local_d0.struct_def = (field->value).type.struct_def;
  local_d0.enum_def = (field->value).type.enum_def;
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&import_entry,&this->namer_,field);
  local_108 = code_ptr;
  std::__cxx11::string::append((string *)code_ptr);
  type = &field->value;
  local_100 = (_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
               *)imports;
  std::__cxx11::string::~string((string *)&import_entry);
  GenPackageReference_abi_cxx11_(&local_148.first,this,&type->type);
  local_f8 = &type->type;
  GenTypeGet_abi_cxx11_(&return_type,this,&type->type);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&import_entry,&local_148.first,&return_type);
  std::__cxx11::string::~string((string *)&return_type);
  std::__cxx11::string::~string((string *)&local_148);
  psVar2 = local_108;
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
    ReturnType_abi_cxx11_(&return_type,this,struct_def,field);
    psVar2 = local_108;
    std::operator+(&local_168,"(self, j: int) -> Optional[",&return_type);
    this_00 = local_100;
    std::operator+(&local_148.first,&local_168,"]");
    std::__cxx11::string::append((string *)psVar2);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[7],_const_char_(&)[9],_true>
              (&local_148,(char (*) [7])0x283254,(char (*) [9])"Optional");
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(this_00,&local_148);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_148);
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>const&>
              (this_00,&import_entry);
    std::__cxx11::string::~string((string *)&return_type);
  }
  else {
    std::__cxx11::string::append((char *)local_108);
  }
  OffsetPrefix_abi_cxx11_(&return_type,this,field,true);
  std::operator+(&local_148.first,":",&return_type);
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&return_type);
  std::operator+(&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&return_type,&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_148.first,&return_type,"x = self._tab.Vector(o)\n");
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&return_type);
  std::__cxx11::string::~string((string *)&local_168);
  std::operator+(&return_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_148.first,&return_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&return_type);
  std::__cxx11::string::append((char *)psVar2);
  t = InlineSize(&local_d0);
  NumToString<unsigned_long>(&return_type,t);
  std::operator+(&local_148.first,&return_type,"\n");
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&return_type);
  if ((local_d0.struct_def)->fixed == false) {
    std::operator+(&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_);
    std::operator+(&return_type,&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_);
    std::operator+(&local_148.first,&return_type,"x = self._tab.Indirect(x)\n");
    std::__cxx11::string::append((string *)psVar2);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&return_type);
    std::__cxx11::string::~string((string *)&local_168);
  }
  pPVar1 = (this->super_BaseGenerator).parser_;
  if (((pPVar1->opts).include_dependence_headers == true) && ((pPVar1->opts).python_typing == false)
     ) {
    std::operator+(&return_type,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_);
    std::operator+(&local_148.first,&return_type,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_);
    std::__cxx11::string::append((string *)psVar2);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&return_type);
    std::operator+(&local_f0,"from ",&import_entry.first);
    std::operator+(&local_168,&local_f0," import ");
    std::operator+(&return_type,&local_168,&import_entry.second);
    std::operator+(&local_148.first,&return_type,"\n");
    std::__cxx11::string::append((string *)psVar2);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&return_type);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_f0,&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_168,&local_f0,"obj = ");
  GenTypeGet_abi_cxx11_(&local_70,this,local_f8);
  std::operator+(&return_type,&local_168,&local_70);
  std::operator+(&local_148.first,&return_type,"()\n");
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&return_type);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&return_type,&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_148.first,&return_type,"obj.Init(self._tab.Bytes, x)\n");
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&return_type);
  std::__cxx11::string::~string((string *)&local_168);
  std::operator+(&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&return_type,&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_148.first,&return_type,"return obj\n");
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&return_type);
  std::__cxx11::string::~string((string *)&local_168);
  std::operator+(&return_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_148.first,&return_type,"return None\n\n");
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&return_type);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&import_entry);
  return;
}

Assistant:

void GetMemberOfVectorOfStruct(const StructDef &struct_def,
                                 const FieldDef &field, std::string *code_ptr,
                                 ImportMap &imports) const {
    auto &code = *code_ptr;
    auto vectortype = field.value.type.VectorType();

    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field);
    const ImportMapEntry import_entry = {
      GenPackageReference(field.value.type), TypeName(field)
    };

    if (parser_.opts.python_typing) {
      const std::string return_type = ReturnType(struct_def, field);
      code += "(self, j: int) -> Optional[" + return_type + "]";
      imports.insert(ImportMapEntry{ "typing", "Optional" });
      imports.insert(import_entry);
    } else {
      code += "(self, j)";
    }
    code += ":" + OffsetPrefix(field);
    code += Indent + Indent + Indent + "x = self._tab.Vector(o)\n";
    code += Indent + Indent + Indent;
    code += "x += flatbuffers.number_types.UOffsetTFlags.py_type(j) * ";
    code += NumToString(InlineSize(vectortype)) + "\n";
    if (!(vectortype.struct_def->fixed)) {
      code += Indent + Indent + Indent + "x = self._tab.Indirect(x)\n";
    }
    if (parser_.opts.include_dependence_headers &&
        !parser_.opts.python_typing) {
      code += Indent + Indent + Indent;
      code += "from " + import_entry.first + " import " + import_entry.second +
              "\n";
    }
    code += Indent + Indent + Indent + "obj = " + TypeName(field) + "()\n";
    code += Indent + Indent + Indent + "obj.Init(self._tab.Bytes, x)\n";
    code += Indent + Indent + Indent + "return obj\n";
    code += Indent + Indent + "return None\n\n";
  }